

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_end_stream(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  csubstr tag;
  csubstr tag_00;
  Location loc;
  csubstr anchor;
  csubstr val;
  bool bVar4;
  error_flags eVar5;
  size_t sVar6;
  NodeType NVar7;
  char *node;
  Parser *in_RDI;
  bool bVar8;
  csubstr cVar9;
  char msg_1 [48];
  size_t added_id;
  csubstr scalar_1;
  csubstr scalar;
  NodeType_e quoted;
  NodeData *added;
  char msg [34];
  undefined4 in_stack_fffffffffffffc68;
  flag_t in_stack_fffffffffffffc6c;
  Parser *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  Location *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  Location *in_stack_fffffffffffffc90;
  Parser *in_stack_fffffffffffffcb8;
  Tree *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  undefined1 uVar10;
  csubstr *in_stack_fffffffffffffcd0;
  uint7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  csubstr *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  csubstr *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  char *in_stack_fffffffffffffd28;
  undefined6 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd36;
  undefined1 in_stack_fffffffffffffd37;
  basic_substring<char_const> local_2b0 [16];
  undefined8 local_2a0;
  Parser *pPStack_298;
  char *local_290;
  Location *pLStack_288;
  char *local_280;
  char local_278 [48];
  char *local_248;
  type_bits in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc8 [16];
  char *in_stack_fffffffffffffdd8;
  size_t in_stack_fffffffffffffde0;
  NodeType_e local_1f0;
  basic_substring<char_const> local_1e8 [16];
  char *local_1d8;
  size_t local_1d0;
  csubstr local_1c8;
  undefined8 in_stack_fffffffffffffe48;
  flag_t quoted_00;
  Parser *in_stack_fffffffffffffe50;
  NodeData *local_198;
  undefined8 local_190;
  Parser *pPStack_188;
  char *local_180;
  Location *pLStack_178;
  char *local_170;
  char local_168 [48];
  csubstr *local_138;
  csubstr *local_130;
  csubstr *local_128;
  csubstr *local_120;
  csubstr *local_118;
  undefined8 local_110;
  NodeType_e *local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  size_t local_f0;
  Tree *local_e8;
  NodeData *local_e0;
  size_t local_d8;
  Tree *local_d0;
  NodeData *local_c8;
  size_t local_c0;
  Tree *local_b8;
  NodeData *local_b0;
  undefined8 local_98;
  csubstr *local_90;
  undefined8 local_78;
  Parser *pPStack_70;
  char *local_68;
  Location *pLStack_60;
  char *local_58;
  stack<c4::yml::Parser::State,_16UL> *local_50;
  size_t local_48;
  Tree *local_40;
  size_t local_38;
  Tree *local_30;
  size_t local_28;
  Tree *local_20;
  NodeData *local_18;
  NodeData *local_10;
  NodeData *local_8;
  
  quoted_00 = (flag_t)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  sVar6 = detail::stack<c4::yml::Parser::State,_16UL>::empty(&in_RDI->m_stack);
  if (sVar6 != 0) {
    memcpy(local_168,"check failed: (! m_stack.empty())",0x22);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                       (size_t)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
                       (size_t)in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc68 = (undefined4)local_190;
    in_stack_fffffffffffffc6c = (flag_t)((ulong)local_190 >> 0x20);
    LVar2.super_LineCol.line = (size_t)pPStack_188;
    LVar2.super_LineCol.offset = local_190;
    LVar2.super_LineCol.col = (size_t)local_180;
    LVar2.name.str = (char *)pLStack_178;
    LVar2.name.len = (size_t)local_170;
    (*p_Var1)(local_168,0x22,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffc70 = pPStack_188;
    in_stack_fffffffffffffc78 = local_180;
    in_stack_fffffffffffffc80 = pLStack_178;
    in_stack_fffffffffffffc88 = local_170;
  }
  local_198 = (NodeData *)0x0;
  bVar4 = has_any(in_RDI,0x200);
  if (bVar4) {
    local_b8 = in_RDI->m_tree;
    local_c0 = in_RDI->m_state->node_id;
    local_b0 = Tree::_p(in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
    if (((local_b0->m_type).type & SEQ) == NOTYPE) {
      local_e8 = in_RDI->m_tree;
      local_f0 = in_RDI->m_state->node_id;
      local_e0 = Tree::_p(in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
      if (((local_e0->m_type).type & MAP) == NOTYPE) {
        local_20 = in_RDI->m_tree;
        local_28 = in_RDI->m_state->node_id;
        local_18 = Tree::_p(in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
        bVar4 = true;
        if (((local_18->m_type).type & DOC) == NOTYPE) {
          NVar7 = Tree::type((Tree *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                             0x3a215d);
          local_f8 = &stack0xfffffffffffffe50;
          local_100 = 0;
          bVar4 = NVar7.type == NOTYPE;
        }
        if (bVar4) {
          has_any(in_RDI,0x400);
          local_1c8 = _consume_scalar(in_stack_fffffffffffffcb8);
          local_1d8 = local_1c8.str;
          local_1d0 = local_1c8.len;
          cVar9.len = in_stack_fffffffffffffde0;
          cVar9.str = in_stack_fffffffffffffdd8;
          Tree::to_val(in_stack_fffffffffffffdc8._8_8_,in_stack_fffffffffffffdc8._0_8_,cVar9,
                       in_stack_fffffffffffffdc0);
          local_198 = Tree::get((Tree *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8
                                                ),(size_t)in_stack_fffffffffffffcc0);
        }
        else {
          bVar4 = is_debugger_attached();
          if ((bVar4) && (bVar4 = is_debugger_attached(), bVar4)) {
            trap_instruction();
          }
          basic_substring<char_const>::basic_substring<22ul>
                    (local_1e8,(char (*) [22])"ERROR: internal error");
          _err<>((Parser *)msg_1._16_8_,(csubstr)msg_1._24_16_);
        }
      }
      else {
        local_198 = _append_key_val_null
                              ((Parser *)
                               CONCAT17(in_stack_fffffffffffffd37,
                                        CONCAT16(in_stack_fffffffffffffd36,in_stack_fffffffffffffd30
                                                )),in_stack_fffffffffffffd28);
      }
    }
    else {
      cVar9 = _consume_scalar(in_stack_fffffffffffffcb8);
      local_198 = _append_val(in_stack_fffffffffffffe50,cVar9,quoted_00);
    }
  }
  else {
    bVar4 = has_all(in_RDI,0x88);
    if ((bVar4) && (bVar4 = has_none(in_RDI,0x10), bVar4)) {
      local_198 = _append_val_null((Parser *)
                                   CONCAT17(in_stack_fffffffffffffd37,
                                            CONCAT16(in_stack_fffffffffffffd36,
                                                     in_stack_fffffffffffffd30)),
                                   in_stack_fffffffffffffd28);
    }
    else {
      local_118 = &in_RDI->m_val_tag;
      bVar4 = true;
      if ((in_RDI->m_val_tag).len != 0) {
        bVar4 = local_118->str == (char *)0x0;
      }
      bVar8 = false;
      if (!bVar4) {
        local_30 = in_RDI->m_tree;
        local_38 = in_RDI->m_state->node_id;
        local_10 = Tree::_p(in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
        bVar8 = true;
        if (((local_10->m_type).type & DOC) == NOTYPE) {
          local_1f0 = (NodeType_e)
                      Tree::type((Tree *)CONCAT44(in_stack_fffffffffffffc6c,
                                                  in_stack_fffffffffffffc68),0x3a2409);
          local_108 = &local_1f0;
          local_110 = 0;
          bVar8 = local_1f0 == NOTYPE;
        }
      }
      if (bVar8) {
        local_90 = &(in_RDI->m_state->line_contents).rem;
        local_98 = 0;
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80);
        val.len = in_stack_fffffffffffffde0;
        val.str = in_stack_fffffffffffffdd8;
        Tree::to_val(in_stack_fffffffffffffdc8._8_8_,in_stack_fffffffffffffdc8._0_8_,val,
                     in_stack_fffffffffffffdc0);
        local_198 = Tree::get((Tree *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                              (size_t)in_stack_fffffffffffffcc0);
      }
    }
  }
  if (local_198 == (NodeData *)0x0) goto LAB_003a29dc;
  node = (char *)Tree::id((Tree *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                          (NodeData *)in_stack_fffffffffffffcc0);
  local_d0 = in_RDI->m_tree;
  local_d8 = in_RDI->m_state->node_id;
  local_c8 = Tree::_p(in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
  if (((local_c8->m_type).type & SEQ) == NOTYPE) {
    local_40 = in_RDI->m_tree;
    local_48 = in_RDI->m_state->node_id;
    local_8 = Tree::_p(in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
    if (((local_8->m_type).type & DOC) != NOTYPE) goto LAB_003a273b;
  }
  else {
LAB_003a273b:
    in_stack_fffffffffffffcf0 = &in_RDI->m_key_anchor;
    in_stack_fffffffffffffcff = true;
    if ((in_RDI->m_key_anchor).len != 0) {
      in_stack_fffffffffffffcff = in_stack_fffffffffffffcf0->str == (char *)0x0;
    }
    local_120 = in_stack_fffffffffffffcf0;
    if ((bool)in_stack_fffffffffffffcff == false) {
      (in_RDI->m_val_anchor).str = (in_RDI->m_key_anchor).str;
      (in_RDI->m_val_anchor).len = (in_RDI->m_key_anchor).len;
      basic_substring<const_char>::operator=(&in_RDI->m_key_anchor,(nullptr_t)0x0);
    }
    in_stack_fffffffffffffce0 = &in_RDI->m_key_tag;
    in_stack_fffffffffffffcef = true;
    if ((in_RDI->m_key_tag).len != 0) {
      in_stack_fffffffffffffcef = in_stack_fffffffffffffce0->str == (char *)0x0;
    }
    local_128 = in_stack_fffffffffffffce0;
    if ((bool)in_stack_fffffffffffffcef == false) {
      (in_RDI->m_val_tag).str = (in_RDI->m_key_tag).str;
      (in_RDI->m_val_tag).len = (in_RDI->m_key_tag).len;
      basic_substring<const_char>::operator=(&in_RDI->m_key_tag,(nullptr_t)0x0);
    }
  }
  in_stack_fffffffffffffcd0 = &in_RDI->m_val_anchor;
  in_stack_fffffffffffffcdf = true;
  if ((in_RDI->m_val_anchor).len != 0) {
    in_stack_fffffffffffffcdf = in_stack_fffffffffffffcd0->str == (char *)0x0;
  }
  local_130 = in_stack_fffffffffffffcd0;
  if ((bool)in_stack_fffffffffffffcdf == false) {
    anchor.len._0_7_ = in_stack_fffffffffffffce8;
    anchor.str = (char *)in_stack_fffffffffffffce0;
    anchor.len._7_1_ = in_stack_fffffffffffffcef;
    Tree::set_val_anchor
              ((Tree *)(ulong)in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0,anchor);
    basic_substring<const_char>::operator=(&in_RDI->m_val_anchor,(nullptr_t)0x0);
  }
  in_stack_fffffffffffffcc0 = (Tree *)&in_RDI->m_val_tag;
  uVar10 = true;
  if ((in_RDI->m_val_tag).len != 0) {
    uVar10 = ((csubstr *)in_stack_fffffffffffffcc0)->str == (char *)0x0;
  }
  local_138 = (csubstr *)in_stack_fffffffffffffcc0;
  if ((bool)uVar10 == false) {
    local_248 = (in_RDI->m_val_tag).str;
    tag.len = (size_t)in_stack_fffffffffffffcc0;
    tag.str = node;
    normalize_tag(tag);
    tag_00.str._7_1_ = uVar10;
    tag_00.str._0_7_ = in_stack_fffffffffffffcc8;
    tag_00.len = (size_t)in_stack_fffffffffffffcd0;
    Tree::set_val_tag(in_stack_fffffffffffffcc0,(size_t)node,tag_00);
    basic_substring<const_char>::operator=(&in_RDI->m_val_tag,(nullptr_t)0x0);
  }
LAB_003a29dc:
  while (sVar6 = detail::stack<c4::yml::Parser::State,_16UL>::size(&in_RDI->m_stack), 1 < sVar6) {
    local_50 = &in_RDI->m_stack;
    if ((in_RDI->m_stack).m_size == 0) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         (size_t)in_stack_fffffffffffffc70,
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      in_stack_fffffffffffffc68 = (undefined4)local_78;
      in_stack_fffffffffffffc6c = (flag_t)((ulong)local_78 >> 0x20);
      loc.super_LineCol.line._0_7_ = in_stack_fffffffffffffcd8;
      loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffcd0;
      loc.super_LineCol.line._7_1_ = in_stack_fffffffffffffcdf;
      loc.super_LineCol.col = (size_t)in_stack_fffffffffffffce0;
      loc.name.str._0_7_ = in_stack_fffffffffffffce8;
      loc.name.str._7_1_ = in_stack_fffffffffffffcef;
      loc.name.len = (size_t)in_stack_fffffffffffffcf0;
      in_stack_fffffffffffffc70 = pPStack_70;
      in_stack_fffffffffffffc78 = local_68;
      in_stack_fffffffffffffc80 = pLStack_60;
      in_stack_fffffffffffffc88 = local_58;
      error<25ul>((char (*) [25])in_stack_fffffffffffffcc0,loc);
    }
    bVar4 = has_any(0x200,(in_RDI->m_stack).m_stack + ((in_RDI->m_stack).m_size - 1));
    if (bVar4) {
      memcpy(local_278,"check failed: (! has_any(SSCL, &m_stack.top()))",0x30);
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                         (size_t)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
                         (size_t)in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc68 = (undefined4)local_2a0;
      in_stack_fffffffffffffc6c = (flag_t)((ulong)local_2a0 >> 0x20);
      LVar3.super_LineCol.line = (size_t)pPStack_298;
      LVar3.super_LineCol.offset = local_2a0;
      LVar3.super_LineCol.col = (size_t)local_290;
      LVar3.name.str = (char *)pLStack_288;
      LVar3.name.len = (size_t)local_280;
      in_stack_fffffffffffffc70 = pPStack_298;
      in_stack_fffffffffffffc78 = local_290;
      in_stack_fffffffffffffc80 = pLStack_288;
      in_stack_fffffffffffffc88 = local_280;
      (*p_Var1)(local_278,0x30,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    bVar4 = has_all(in_RDI,0x18);
    if (bVar4) {
      basic_substring<char_const>::basic_substring<20ul>
                (local_2b0,(char (*) [20])"closing ] not found");
      _err<>((Parser *)msg_1._16_8_,(csubstr)msg_1._24_16_);
    }
    _pop_level((Parser *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  }
  add_flags(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  return;
}

Assistant:

void Parser::_end_stream()
{
    _c4dbgpf("end_stream, level={} node_id={}", m_state->level, m_state->node_id);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_stack.empty());
    NodeData *added = nullptr;
    if(has_any(SSCL))
    {
        if(m_tree->is_seq(m_state->node_id))
        {
            _c4dbgp("append val...");
            added = _append_val(_consume_scalar());
        }
        else if(m_tree->is_map(m_state->node_id))
        {
            _c4dbgp("append null key val...");
            added = _append_key_val_null(m_state->line_contents.rem.str);
            #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
            if(has_any(RSEQIMAP))
            {
                _stop_seqimap();
                _pop_level();
            }
            #endif
        }
        else if(m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE)
        {
            NodeType_e quoted = has_any(QSCL) ? VALQUO : NOTYPE; // do this before consuming the scalar
            csubstr scalar = _consume_scalar();
            _c4dbgpf("node[{}]: to docval '{}'{}", m_state->node_id, scalar, quoted == VALQUO ? ", quoted" : "");
            m_tree->to_val(m_state->node_id, scalar, DOC|quoted);
            added = m_tree->get(m_state->node_id);
        }
        else
        {
            _c4err("internal error");
        }
    }
    else if(has_all(RSEQ|RVAL) && has_none(FLOW))
    {
        _c4dbgp("add last...");
        added = _append_val_null(m_state->line_contents.rem.str);
    }
    else if(!m_val_tag.empty() && (m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE))
    {
        csubstr scalar = m_state->line_contents.rem.first(0);
        _c4dbgpf("node[{}]: add null scalar as docval", m_state->node_id);
        m_tree->to_val(m_state->node_id, scalar, DOC);
        added = m_tree->get(m_state->node_id);
    }

    if(added)
    {
        size_t added_id = m_tree->id(added);
        if(m_tree->is_seq(m_state->node_id) || m_tree->is_doc(m_state->node_id))
        {
            if(!m_key_anchor.empty())
            {
                _c4dbgpf("node[{}]: move key to val anchor: '{}'", added_id, m_key_anchor);
                m_val_anchor = m_key_anchor;
                m_key_anchor = {};
            }
            if(!m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: move key to val tag: '{}'", added_id, m_key_tag);
                m_val_tag = m_key_tag;
                m_key_tag = {};
            }
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_anchor.empty())
        {
            _c4dbgpf("node[{}]: set key anchor='{}'", added_id, m_key_anchor);
            m_tree->set_key_anchor(added_id, m_key_anchor);
            m_key_anchor = {};
        }
        #endif
        if(!m_val_anchor.empty())
        {
            _c4dbgpf("node[{}]: set val anchor='{}'", added_id, m_val_anchor);
            m_tree->set_val_anchor(added_id, m_val_anchor);
            m_val_anchor = {};
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_tag.empty())
        {
            _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", added_id, m_key_tag, normalize_tag(m_key_tag));
            m_tree->set_key_tag(added_id, normalize_tag(m_key_tag));
            m_key_tag = {};
        }
        #endif
        if(!m_val_tag.empty())
        {
            _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", added_id, m_val_tag, normalize_tag(m_val_tag));
            m_tree->set_val_tag(added_id, normalize_tag(m_val_tag));
            m_val_tag = {};
        }
    }

    while(m_stack.size() > 1)
    {
        _c4dbgpf("popping level: {} (stack sz={})", m_state->level, m_stack.size());
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL, &m_stack.top()));
        if(has_all(RSEQ|FLOW))
            _err("closing ] not found");
        _pop_level();
    }
    add_flags(NDOC);
}